

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_gej_add_ge_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *rzr)

{
  secp256k1_fe *a_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  long lVar5;
  secp256k1_fe s1;
  secp256k1_fe u1;
  secp256k1_fe local_188;
  secp256k1_fe local_158;
  secp256k1_fe u2;
  secp256k1_fe z12;
  secp256k1_fe local_d8;
  secp256k1_fe s2;
  secp256k1_fe t;
  secp256k1_fe h3;
  
  if (a->infinity == 0) {
    if (b->infinity == 0) {
      a_00 = &a->z;
      secp256k1_fe_impl_sqr(&z12,a_00);
      u1.n[4] = (a->x).n[4];
      u1.n[0] = (a->x).n[0];
      u1.n[1] = (a->x).n[1];
      u1.n[2] = (a->x).n[2];
      u1.n[3] = (a->x).n[3];
      secp256k1_fe_impl_mul(&u2,&b->x,&z12);
      s1.n[4] = (a->y).n[4];
      s1.n[0] = (a->y).n[0];
      s1.n[1] = (a->y).n[1];
      s1.n[2] = (a->y).n[2];
      s1.n[3] = (a->y).n[3];
      secp256k1_fe_impl_mul(&s2,&b->y,&z12);
      secp256k1_fe_impl_mul(&s2,&s2,a_00);
      local_158.n[0] = (u2.n[0] - u1.n[0]) + 0x9ffff5ffffd9d6;
      local_158.n[1] = (u2.n[1] - u1.n[1]) + 0x9ffffffffffff6;
      local_158.n[2] = (u2.n[2] - u1.n[2]) + 0x9ffffffffffff6;
      local_158.n[3] = (u2.n[3] - u1.n[3]) + 0x9ffffffffffff6;
      local_158.n[4] = (u2.n[4] - u1.n[4]) + 0x9fffffffffff6;
      local_188.n[0] = (s1.n[0] - s2.n[0]) + 0x3ffffbfffff0bc;
      local_188.n[1] = (s1.n[1] - s2.n[1]) + 0x3ffffffffffffc;
      local_188.n[2] = (s1.n[2] - s2.n[2]) + 0x3ffffffffffffc;
      local_188.n[3] = (s1.n[3] - s2.n[3]) + 0x3ffffffffffffc;
      local_188.n[4] = (s1.n[4] - s2.n[4]) + 0x3fffffffffffc;
      iVar4 = secp256k1_fe_impl_normalizes_to_zero_var(&local_158);
      if (iVar4 == 0) {
        r->infinity = 0;
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[4] = local_158.n[4];
          rzr->n[2] = local_158.n[2];
          rzr->n[3] = local_158.n[3];
          rzr->n[0] = local_158.n[0];
          rzr->n[1] = local_158.n[1];
        }
        secp256k1_fe_impl_mul(&r->z,a_00,&local_158);
        secp256k1_fe_impl_sqr(&local_d8,&local_158);
        local_d8.n[0] = 0x3ffffbfffff0bc - local_d8.n[0];
        local_d8.n[1] = 0x3ffffffffffffc - local_d8.n[1];
        local_d8.n[2] = 0x3ffffffffffffc - local_d8.n[2];
        local_d8.n[3] = 0x3ffffffffffffc - local_d8.n[3];
        local_d8.n[4] = 0x3fffffffffffc - local_d8.n[4];
        secp256k1_fe_impl_mul(&h3,&local_d8,&local_158);
        secp256k1_fe_impl_mul(&t,&u1,&local_d8);
        secp256k1_fe_impl_sqr(&r->x,&local_188);
        secp256k1_fe_impl_add(&r->x,&h3);
        secp256k1_fe_impl_add(&r->x,&t);
        secp256k1_fe_impl_add(&r->x,&t);
        secp256k1_fe_impl_add(&t,&r->x);
        secp256k1_fe_impl_mul(&r->y,&t,&local_188);
        secp256k1_fe_impl_mul(&h3,&h3,&s1);
        secp256k1_fe_impl_add(&r->y,&h3);
      }
      else {
        iVar4 = secp256k1_fe_impl_normalizes_to_zero_var(&local_188);
        if (iVar4 != 0) {
          secp256k1_gej_double_var(r,a,rzr);
          return;
        }
        if (rzr != (secp256k1_fe *)0x0) {
          rzr->n[2] = 0;
          rzr->n[3] = 0;
          rzr->n[0] = 0;
          rzr->n[1] = 0;
          rzr->n[4] = 0;
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
      }
    }
    else {
      if (rzr != (secp256k1_fe *)0x0) {
        rzr->n[0] = 1;
        rzr->n[1] = 0;
        rzr->n[2] = 0;
        rzr->n[3] = 0;
        rzr->n[4] = 0;
      }
      for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
        (r->x).n[0] = (a->x).n[0];
        a = (secp256k1_gej *)((a->x).n + 1);
        r = (secp256k1_gej *)((r->x).n + 1);
      }
    }
  }
  else {
    r->infinity = b->infinity;
    uVar1 = (b->x).n[1];
    uVar2 = (b->x).n[2];
    uVar3 = (b->x).n[3];
    (r->x).n[0] = (b->x).n[0];
    (r->x).n[1] = uVar1;
    (r->x).n[2] = uVar2;
    (r->x).n[3] = uVar3;
    (r->x).n[4] = (b->x).n[4];
    uVar1 = (b->y).n[1];
    uVar2 = (b->y).n[2];
    uVar3 = (b->y).n[3];
    (r->y).n[0] = (b->y).n[0];
    (r->y).n[1] = uVar1;
    (r->y).n[2] = uVar2;
    (r->y).n[3] = uVar3;
    (r->y).n[4] = (b->y).n[4];
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_gej_add_ge_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, secp256k1_fe *rzr) {
    /* Operations: 8 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity) {
        VERIFY_CHECK(rzr == NULL);
        secp256k1_gej_set_ge(r, b);
        return;
    }
    if (b->infinity) {
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        *r = *a;
        return;
    }

    secp256k1_fe_sqr(&z12, &a->z);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &a->z);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, rzr);
        } else {
            if (rzr != NULL) {
                secp256k1_fe_set_int(rzr, 0);
            }
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    if (rzr != NULL) {
        *rzr = h;
    }
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
    if (rzr != NULL) SECP256K1_FE_VERIFY(rzr);
}